

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O1

void __thiscall JPG::convertToYCbCr(JPG *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  YCbCr *pYVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (this->height != 0) {
    uVar5 = 0;
    do {
      uVar7 = this->width;
      if (uVar7 != 0) {
        uVar6 = 0;
        do {
          pYVar4 = this->BMPData;
          uVar7 = uVar7 * uVar5 + uVar6;
          dVar1 = pYVar4[uVar7].field_0.Y;
          dVar2 = pYVar4[uVar7].field_1.Cb;
          dVar3 = pYVar4[uVar7].field_2.Cr;
          pYVar4[uVar7].field_0.Y = dVar3 * 0.114 + dVar1 * 0.299 + dVar2 * 0.587;
          this->BMPData[this->width * uVar5 + uVar6].field_1.Cb =
               dVar3 * 0.5 + dVar1 * -0.1687 + dVar2 * -0.3313 + 128.0;
          this->BMPData[this->width * uVar5 + uVar6].field_2.Cr =
               dVar3 * -0.0813 + dVar1 * 0.5 + dVar2 * -0.4187 + 128.0;
          uVar6 = uVar6 + 1;
          uVar7 = this->width;
        } while (uVar6 < uVar7);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->height);
  }
  return;
}

Assistant:

void JPG::convertToYCbCr() {
    for(uint i = 0; i < height; i++) {
        for(uint j = 0; j < width; j++) {
            YCbCr temp = BMPData[i * width + j];
            BMPData[i * width + j].Y  =  0.299  * temp.red + 0.587 * temp.green  + 0.114  * temp.blue;
            BMPData[i * width + j].Cb = -0.1687 * temp.red - 0.3313 * temp.green + 0.5    * temp.blue + 128;
            BMPData[i * width + j].Cr =  0.5    * temp.red - 0.4187 * temp.green - 0.0813 * temp.blue + 128;
        }
    }
}